

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O2

int32 dumbfile_getnc(char *ptr,int32 n,DUMBFILE *f)

{
  _func_int32_char_ptr_int32_void_ptr *p_Var1;
  int32 iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (f->pos < 0) {
    iVar2 = -1;
  }
  else {
    p_Var1 = f->dfs->getnc;
    if (p_Var1 == (_func_int32_char_ptr_int32_void_ptr *)0x0) {
      uVar5 = 0;
      uVar4 = (ulong)(uint)n;
      if (n < 1) {
        uVar4 = uVar5;
      }
      while( true ) {
        iVar2 = (int32)uVar4;
        if (iVar2 == (int)uVar5) break;
        iVar3 = (*f->dfs->getc)(f->file);
        if (iVar3 < 0) {
          f->pos = -1;
          return (int)uVar5;
        }
        ptr[uVar5] = (char)iVar3;
        uVar5 = uVar5 + 1;
      }
    }
    else {
      iVar2 = (*p_Var1)(ptr,n,f->file);
      if (iVar2 < n) {
        f->pos = -1;
        if (iVar2 < 1) {
          return 0;
        }
        return iVar2;
      }
    }
    f->pos = f->pos + (long)iVar2;
  }
  return iVar2;
}

Assistant:

int32 DUMBEXPORT dumbfile_getnc(char *ptr, int32 n, DUMBFILE *f)
{
	int32 rv;

	ASSERT(f);
	ASSERT(n >= 0);

	if (f->pos < 0)
		return -1;

	if (f->dfs->getnc) {
		rv = (*f->dfs->getnc)(ptr, n, f->file);
		if (rv < n) {
			f->pos = -1;
			return MAX(rv, 0);
		}
	} else {
		for (rv = 0; rv < n; rv++) {
			int c = (*f->dfs->getc)(f->file);
			if (c < 0) {
				f->pos = -1;
				return rv;
			}
			*ptr++ = c;
		}
	}

	f->pos += rv;

	return rv;
}